

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeEventHostSignal(ze_event_handle_t hEvent)

{
  ze_pfnEventHostSignal_t pfnHostSignal;
  ze_result_t result;
  ze_event_handle_t hEvent_local;
  
  pfnHostSignal._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c5e0 != (code *)0x0) {
    pfnHostSignal._4_4_ = (*DAT_0011c5e0)(hEvent);
  }
  return pfnHostSignal._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventHostSignal(
        ze_event_handle_t hEvent                        ///< [in] handle of the event
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnHostSignal = context.zeDdiTable.Event.pfnHostSignal;
        if( nullptr != pfnHostSignal )
        {
            result = pfnHostSignal( hEvent );
        }
        else
        {
            // generic implementation
        }

        return result;
    }